

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

cram_fd * cram_dopen(hFILE *fp,char *filename,char *mode)

{
  uint *puVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [16];
  int iVar19;
  cram_fd *fd;
  cram_file_def *pcVar20;
  SAM_hdr *pSVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  refs_t *r;
  cram_metrics *pcVar25;
  SAM_hdr *h;
  ulong uVar26;
  char *pcVar27;
  char (*__s) [32];
  bool bVar28;
  undefined1 auVar29 [16];
  long lVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ushort uVar38;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [15];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined4 uVar39;
  undefined6 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [14];
  undefined1 auVar46 [16];
  
  fd = (cram_fd *)calloc(1,0x8900);
  if (fd == (cram_fd *)0x0) {
    return (cram_fd *)0x0;
  }
  fd->level = 5;
  cVar2 = *mode;
  if (cVar2 == '\0') {
    fd->fp = fp;
    fd->mode = 0;
LAB_00131674:
    pcVar20 = (cram_file_def *)calloc(1,0x1a);
    if (pcVar20 == (cram_file_def *)0x0) {
      return (cram_fd *)0x0;
    }
    fd->file_def = pcVar20;
    builtin_strncpy(pcVar20->magic,"CRAM",4);
    strncpy(pcVar20->file_id,filename,0x14);
    fd->version = 0x201;
    bVar28 = false;
  }
  else {
    pcVar27 = mode + 1;
    cVar3 = cVar2;
    do {
      if ((byte)(cVar3 - 0x30U) < 10) {
        fd->level = (uint)(byte)(cVar3 - 0x30U);
        break;
      }
      cVar3 = *pcVar27;
      pcVar27 = pcVar27 + 1;
    } while (cVar3 != '\0');
    fd->fp = fp;
    fd->mode = (int)cVar2;
    if (cVar2 != 'r') goto LAB_00131674;
    pcVar20 = cram_read_file_def(fd);
    fd->file_def = pcVar20;
    if (pcVar20 == (cram_file_def *)0x0) goto LAB_00131cb3;
    uVar38._0_1_ = pcVar20->major_version;
    uVar38._1_1_ = pcVar20->minor_version;
    fd->version = (uint)(ushort)(uVar38 << 8 | uVar38 >> 8);
    pSVar21 = cram_read_SAM_hdr(fd);
    fd->header = pSVar21;
    if (pSVar21 == (SAM_hdr *)0x0) goto LAB_00131cb3;
    bVar28 = (fd->version & 0xffffff00U) == 0x100;
  }
  memset(fd->L1,4,0x100);
  fd->L1[0x41] = '\0';
  fd->L1[0x61] = '\0';
  fd->L1[0x43] = '\x01';
  fd->L1[99] = '\x01';
  fd->L1[0x47] = '\x02';
  fd->L1[0x67] = '\x02';
  fd->L1[0x54] = '\x03';
  fd->L1[0x74] = '\x03';
  memset(fd->L2,5,0x100);
  fd->L2[0x41] = '\0';
  fd->L2[0x61] = '\0';
  fd->L2[0x43] = '\x01';
  fd->L2[99] = '\x01';
  fd->L2[0x47] = '\x02';
  fd->L2[0x67] = '\x02';
  fd->L2[0x54] = '\x03';
  fd->L2[0x74] = '\x03';
  fd->L2[0x4e] = '\x04';
  fd->L2[0x6e] = '\x04';
  auVar30 = _DAT_001470c0;
  if (bVar28) {
    uVar33 = 0;
    uVar34 = 1;
    uVar35 = 2;
    uVar36 = 3;
    lVar22 = 0;
    auVar44 = _DAT_001470b0;
    auVar51 = _DAT_001470a0;
    do {
      auVar54 = auVar44 ^ auVar30;
      auVar29 = auVar51 ^ auVar30;
      puVar1 = fd->bam_flag_swap + lVar22;
      *puVar1 = (uVar33 & 4) << 6 |
                (uVar33 & 8) << 4 | (uVar33 & 0x10) << 2 | uVar33 >> 1 & 0x10 | uVar33 >> 4 & 4 |
                (uVar33 >> 6 & 2) +
                (uint)(auVar54._4_4_ == -0x80000000 && -0x7fffff01 < auVar54._0_4_ ||
                      -0x80000000 < auVar54._4_4_);
      puVar1[1] = (uVar34 & 1) << 10 |
                  (uVar34 & 2) << 8 |
                  (uVar34 & 4) << 6 |
                  (uVar34 & 8) << 4 | (uVar34 & 0x10) << 2 | uVar34 >> 1 & 0x10 | uVar34 >> 4 & 4 |
                  (uVar34 >> 6 & 2) +
                  (uint)(auVar54._12_4_ == -0x80000000 && -0x7fffff01 < auVar54._8_4_ ||
                        -0x80000000 < auVar54._12_4_);
      puVar1[2] = (uVar35 & 2) << 8 |
                  (uVar35 & 4) << 6 |
                  (uVar35 & 8) << 4 | (uVar35 & 0x10) << 2 | uVar35 >> 1 & 0x10 | uVar35 >> 4 & 4 |
                  (uVar35 >> 6 & 2) +
                  (uint)(auVar29._4_4_ == -0x80000000 && -0x7fffff01 < auVar29._0_4_ ||
                        -0x80000000 < auVar29._4_4_);
      puVar1[3] = (uVar36 & 1) << 10 |
                  (uVar36 & 2) << 8 |
                  (uVar36 & 4) << 6 |
                  (uVar36 & 8) << 4 | (uVar36 & 0x10) << 2 | uVar36 >> 1 & 0x10 | uVar36 >> 4 & 4 |
                  (uVar36 >> 6 & 2) +
                  (uint)(auVar29._12_4_ == -0x80000000 && -0x7fffff01 < auVar29._8_4_ ||
                        -0x80000000 < auVar29._12_4_);
      auVar18 = _DAT_00147190;
      auVar54 = _DAT_00147180;
      auVar29 = _DAT_00147170;
      lVar22 = lVar22 + 4;
      lVar32 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 4;
      auVar44._8_8_ = lVar32 + 4;
      lVar32 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + 4;
      auVar51._8_8_ = lVar32 + 4;
      uVar33 = uVar33 + 4;
      uVar34 = uVar34 + 4;
      uVar35 = uVar35 + 4;
      uVar36 = uVar36 + 4;
    } while (lVar22 != 0x200);
    lVar22 = 0;
    auVar30 = _DAT_00147080;
    auVar37 = _DAT_00147080;
    do {
      auVar44 = auVar30 & _DAT_00147160;
      auVar50[1] = 0;
      auVar50[0] = auVar44[8];
      auVar50[2] = auVar44[9];
      auVar50[3] = 0;
      auVar50[4] = auVar44[10];
      auVar50[5] = 0;
      auVar50[6] = auVar44[0xb];
      auVar50[7] = 0;
      auVar50[8] = auVar44[0xc];
      auVar50[9] = 0;
      auVar50[10] = auVar44[0xd];
      auVar50[0xb] = 0;
      auVar50[0xc] = auVar44[0xe];
      auVar50[0xd] = 0;
      auVar50[0xe] = auVar44[0xf];
      auVar50[0xf] = 0;
      auVar51 = pshuflw(auVar50,auVar50,0x1b);
      auVar51 = pshufhw(auVar51,auVar51,0x1b);
      auVar49[0xd] = 0;
      auVar49._0_13_ = auVar44._0_13_;
      auVar49[0xe] = auVar44[7];
      auVar9[0xc] = auVar44[6];
      auVar9._0_12_ = auVar44._0_12_;
      auVar9._13_2_ = auVar49._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar44._0_11_;
      auVar10._12_3_ = auVar9._12_3_;
      auVar11[10] = auVar44[5];
      auVar11._0_10_ = auVar44._0_10_;
      auVar11._11_4_ = auVar10._11_4_;
      auVar12[9] = 0;
      auVar12._0_9_ = auVar44._0_9_;
      auVar12._10_5_ = auVar11._10_5_;
      auVar13[8] = auVar44[4];
      auVar13._0_8_ = auVar44._0_8_;
      auVar13._9_6_ = auVar12._9_6_;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = auVar13._8_7_;
      auVar16._1_8_ = SUB158(auVar15 << 0x40,7);
      auVar16[0] = auVar44[3];
      auVar16._9_6_ = 0;
      auVar17._1_10_ = SUB1510(auVar16 << 0x30,5);
      auVar17[0] = auVar44[2];
      auVar17._11_4_ = 0;
      auVar14[2] = auVar44[1];
      auVar14._0_2_ = auVar44._0_2_;
      auVar14._3_12_ = SUB1512(auVar17 << 0x20,3);
      auVar45._0_2_ = auVar44._0_2_ & 0xff;
      auVar45._2_13_ = auVar14._2_13_;
      auVar45[0xf] = 0;
      auVar44 = pshuflw(auVar45,auVar45,0x1b);
      auVar44 = pshufhw(auVar44,auVar44,0x1b);
      sVar4 = auVar44._0_2_;
      sVar5 = auVar44._2_2_;
      uVar38 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar44[2] - (0xff < sVar5),
                        (0 < sVar4) * (sVar4 < 0x100) * auVar44[0] - (0xff < sVar4));
      sVar4 = auVar44._4_2_;
      sVar5 = auVar44._6_2_;
      uVar39 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar44[6] - (0xff < sVar5),
                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar44[4] - (0xff < sVar4),uVar38)
                       );
      sVar4 = auVar44._8_2_;
      sVar5 = auVar44._10_2_;
      uVar40 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar44[10] - (0xff < sVar5),
                        CONCAT14((0 < sVar4) * (sVar4 < 0x100) * auVar44[8] - (0xff < sVar4),uVar39)
                       );
      sVar4 = auVar44._12_2_;
      sVar5 = auVar44._14_2_;
      uVar41 = CONCAT17((0 < sVar5) * (sVar5 < 0x100) * auVar44[0xe] - (0xff < sVar5),
                        CONCAT16((0 < sVar4) * (sVar4 < 0x100) * auVar44[0xc] - (0xff < sVar4),
                                 uVar40));
      sVar4 = auVar51._0_2_;
      sVar5 = auVar51._2_2_;
      auVar42._0_10_ =
           CONCAT19((0 < sVar5) * (sVar5 < 0x100) * auVar51[2] - (0xff < sVar5),
                    CONCAT18((0 < sVar4) * (sVar4 < 0x100) * auVar51[0] - (0xff < sVar4),uVar41));
      sVar4 = auVar51._4_2_;
      auVar42[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar51[4] - (0xff < sVar4);
      sVar4 = auVar51._6_2_;
      auVar42[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar51[6] - (0xff < sVar4);
      sVar4 = auVar51._8_2_;
      auVar43[0xc] = (0 < sVar4) * (sVar4 < 0x100) * auVar51[8] - (0xff < sVar4);
      auVar43._0_12_ = auVar42;
      sVar4 = auVar51._10_2_;
      auVar43[0xd] = (0 < sVar4) * (sVar4 < 0x100) * auVar51[10] - (0xff < sVar4);
      sVar4 = auVar51._12_2_;
      auVar46[0xe] = (0 < sVar4) * (sVar4 < 0x100) * auVar51[0xc] - (0xff < sVar4);
      auVar46._0_14_ = auVar43;
      sVar4 = auVar51._14_2_;
      auVar46[0xf] = (0 < sVar4) * (sVar4 < 0x100) * auVar51[0xe] - (0xff < sVar4);
      auVar44 = psllw(auVar46,4);
      auVar47._0_2_ = uVar38 >> 4;
      auVar47._2_2_ = (ushort)((uint)uVar39 >> 0x14);
      auVar47._4_2_ = (ushort)((uint6)uVar40 >> 0x24);
      auVar47._6_2_ = (ushort)((ulong)uVar41 >> 0x34);
      auVar47._8_2_ = (ushort)((unkuint10)auVar42._0_10_ >> 0x44);
      auVar47._10_2_ = auVar42._10_2_ >> 4;
      auVar47._12_2_ = auVar43._12_2_ >> 4;
      auVar47._14_2_ = auVar46._14_2_ >> 4;
      auVar44 = auVar47 & auVar29 | auVar44;
      auVar6._2_12_ = auVar44._4_12_;
      auVar6._0_2_ = auVar44._2_2_ >> 2;
      auVar52._0_4_ = auVar6._0_4_ << 0x10;
      auVar52._4_2_ = 0;
      auVar52._6_2_ = auVar44._6_2_ >> 2;
      auVar52._8_2_ = auVar44._8_2_ >> 2;
      auVar52._10_2_ = auVar44._10_2_ >> 2;
      auVar52._12_2_ = auVar44._12_2_ >> 2;
      auVar52._14_2_ = auVar44._14_2_ >> 2;
      auVar44 = psllw(auVar44 & auVar54,2);
      auVar44 = auVar44 | auVar52 & auVar54;
      auVar7._2_12_ = auVar44._4_12_;
      auVar7._0_2_ = auVar44._2_2_ >> 1;
      auVar53._0_4_ = auVar7._0_4_ << 0x10;
      auVar53._4_2_ = 0;
      auVar53._6_2_ = auVar44._6_2_ >> 1;
      auVar53._8_2_ = auVar44._8_2_ >> 1;
      auVar53._10_2_ = auVar44._10_2_ >> 1;
      auVar53._12_2_ = auVar44._12_2_ >> 1;
      auVar53._14_2_ = auVar44._14_2_ >> 1;
      auVar49 = auVar44._1_15_ & auVar18._1_15_;
      auVar8._1_13_ = auVar49._2_13_;
      auVar8[0] = auVar49[1] * '\x02';
      auVar48._0_3_ = auVar8._0_3_ << 0x10;
      auVar48[3] = auVar49[2] * '\x02';
      auVar48._4_2_ = 0;
      auVar48[6] = auVar49[5] * '\x02';
      auVar48[7] = auVar49[6] * '\x02';
      auVar48[8] = auVar49[7] * '\x02';
      auVar48[9] = auVar49[8] * '\x02';
      auVar48[10] = auVar49[9] * '\x02';
      auVar48[0xb] = auVar49[10] * '\x02';
      auVar48[0xc] = auVar49[0xb] * '\x02';
      auVar48[0xd] = auVar49[0xc] * '\x02';
      auVar48[0xe] = auVar49[0xd] * '\x02';
      auVar48[0xf] = auVar49[0xe] * '\x02';
      auVar48 = auVar48 | auVar53 & auVar18;
      uVar33 = auVar37._0_4_;
      uVar34 = auVar37._4_4_;
      uVar35 = auVar37._8_4_;
      uVar36 = auVar37._12_4_;
      puVar1 = fd->cram_flag_swap + lVar22;
      *puVar1 = uVar33 >> 10 & 1 | uVar33 >> 8 & 2 |
                uVar33 >> 6 & 4 | uVar33 >> 4 & 8 | uVar33 >> 2 & 0x10 | uVar33 * 2 & 0x20 |
                auVar48._0_4_ >> 0x17;
      puVar1[1] = uVar34 >> 10 & 1 | uVar34 >> 8 & 2 |
                  uVar34 >> 6 & 4 | uVar34 >> 4 & 8 | uVar34 >> 2 & 0x10 | uVar34 * 2 & 0x20 |
                  auVar48._4_4_ >> 0x17;
      puVar1[2] = uVar35 >> 10 & 1 | uVar35 >> 8 & 2 |
                  uVar35 >> 6 & 4 | uVar35 >> 4 & 8 | uVar35 >> 2 & 0x10 | uVar35 * 2 & 0x20 |
                  auVar48._8_4_ >> 0x17;
      puVar1[3] = uVar36 >> 10 & 1 | uVar36 >> 8 & 2 |
                  uVar36 >> 6 & 4 | uVar36 >> 4 & 8 | uVar36 >> 2 & 0x10 | uVar36 * 2 & 0x20 |
                  auVar48._12_4_ >> 0x17;
      lVar22 = lVar22 + 4;
      auVar37._0_4_ = uVar33 + 4;
      auVar37._4_4_ = uVar34 + 4;
      auVar37._8_4_ = uVar35 + 4;
      auVar37._12_4_ = uVar36 + 4;
      auVar31._0_4_ = auVar30._0_4_ + 4;
      auVar31._4_4_ = auVar30._4_4_ + 4;
      auVar31._8_4_ = auVar30._8_4_ + 4;
      auVar31._12_4_ = auVar30._12_4_ + 4;
      auVar30 = auVar31;
    } while (lVar22 != 0x1000);
  }
  else {
    uVar33 = 0;
    uVar34 = 1;
    uVar35 = 2;
    uVar36 = 3;
    lVar22 = 0;
    do {
      puVar1 = fd->bam_flag_swap + lVar22;
      *puVar1 = uVar33;
      puVar1[1] = uVar34;
      puVar1[2] = uVar35;
      puVar1[3] = uVar36;
      lVar22 = lVar22 + 4;
      uVar33 = uVar33 + 4;
      uVar34 = uVar34 + 4;
      uVar35 = uVar35 + 4;
      uVar36 = uVar36 + 4;
    } while (lVar22 != 0x1000);
    uVar33 = 0;
    uVar34 = 1;
    uVar35 = 2;
    uVar36 = 3;
    lVar22 = 0;
    do {
      puVar1 = fd->cram_flag_swap + lVar22;
      *puVar1 = uVar33;
      puVar1[1] = uVar34;
      puVar1[2] = uVar35;
      puVar1[3] = uVar36;
      lVar22 = lVar22 + 4;
      uVar33 = uVar33 + 4;
      uVar34 = uVar34 + 4;
      uVar35 = uVar35 + 4;
      uVar36 = uVar36 + 4;
    } while (lVar22 != 0x1000);
  }
  __s = fd->cram_sub_matrix;
  memset(__s,4,0x400);
  lVar22 = 0x8435;
  do {
    *(undefined1 *)((long)fd->m + lVar22 + -0x80) = 0;
    *(undefined1 *)((long)fd->m + lVar22 + -0x7e) = 1;
    *(undefined1 *)((long)fd->m + lVar22 + -0x7a) = 2;
    *(undefined1 *)((long)fd->m + lVar22 + -0x6d) = 3;
    *(undefined1 *)((long)fd->m + lVar22 + -0x73) = 4;
    lVar22 = lVar22 + 0x20;
  } while (lVar22 != 0x8835);
  uVar23 = 0xfffffffffffffffc;
  pcVar27 = "ACGTN";
  do {
    uVar26 = (ulong)(((byte)*pcVar27 & 0x1f) << 5);
    builtin_strncpy(*__s + uVar26,
                    "\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03"
                    ,0x14);
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar23 + 4] & 0x1f) + uVar26] = '\0';
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar23 + 5] & 0x1f) + uVar26] = '\x01';
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar23 + 6] & 0x1f) + uVar26] = '\x02';
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar23 + 7] & 0x1f) + uVar26] = '\x03';
    uVar23 = uVar23 + 4;
    pcVar27 = (char *)((byte *)pcVar27 + 1);
  } while (uVar23 < 0x10);
  pcVar24 = strrchr(filename,0x2f);
  pcVar27 = pcVar24 + 1;
  if (pcVar24 == (char *)0x0) {
    pcVar27 = filename;
  }
  pcVar27 = strdup(pcVar27);
  fd->prefix = pcVar27;
  if (pcVar27 != (char *)0x0) {
    fd->first_base = -1;
    fd->last_base = -1;
    fd->record_counter = 0;
    fd->ctr = (cram_container *)0x0;
    r = refs_create();
    fd->refs = r;
    if (r != (refs_t *)0x0) {
      fd->ref_id = -2;
      fd->ref = (char *)0x0;
      fd->decode_md = 0;
      fd->verbose = 0;
      fd->seqs_per_slice = 10000;
      fd->slices_per_container = 1;
      fd->embed_ref = 0;
      fd->no_ref = 0;
      fd->ignore_md5 = 0;
      fd->use_bz2 = 0;
      fd->use_rans = (uint)(0x2ff < fd->version);
      fd->use_lzma = 0;
      fd->multi_seq = -1;
      fd->unsorted = 0;
      fd->shared_ref = 0;
      fd->required_fields = 0x7fffffff;
      fd->index = (cram_index *)0x0;
      fd->job_pending = (void *)0x0;
      fd->ooc = 0;
      *(undefined8 *)&fd->own_pool = 0;
      *(undefined8 *)((long)&fd->pool + 4) = 0;
      *(undefined4 *)((long)&fd->rqueue + 4) = 0;
      lVar22 = 0x10;
      do {
        pcVar25 = (cram_metrics *)calloc(1,0x78);
        if (pcVar25 != (cram_metrics *)0x0) {
          pcVar25->trial = 2;
          pcVar25->next_trial = 0x32;
        }
        fd->m[lVar22 + -0x10] = pcVar25;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x3f);
      (fd->range).refid = -2;
      fd->eof = 1;
      fd->ref_fn = (char *)0x0;
      fd->bl = (spare_bams *)0x0;
      iVar19 = refs_from_header(r,(cram_fd *)fd->header,h);
      if (iVar19 != -1) {
        return fd;
      }
    }
  }
LAB_00131cb3:
  free(fd);
  return (cram_fd *)0x0;
}

Assistant:

cram_fd *cram_dopen(hFILE *fp, const char *filename, const char *mode) {
    int i;
    char *cp;
    cram_fd *fd = calloc(1, sizeof(*fd));
    if (!fd)
	return NULL;

    fd->level = 5;
    for (i = 0; mode[i]; i++) {
	if (mode[i] >= '0' && mode[i] <= '9') {
	    fd->level = mode[i] - '0';
	    break;
	}
    }

    fd->fp = fp;
    fd->mode = *mode;
    fd->first_container = 0;

    if (fd->mode == 'r') {
	/* Reader */

	if (!(fd->file_def = cram_read_file_def(fd)))
	    goto err;

	fd->version = fd->file_def->major_version * 256 +
	    fd->file_def->minor_version;

	if (!(fd->header = cram_read_SAM_hdr(fd)))
	    goto err;

    } else {
	/* Writer */
	cram_file_def *def = calloc(1, sizeof(*def));
	if (!def)
	    return NULL;

	fd->file_def = def;

	def->magic[0] = 'C';
	def->magic[1] = 'R';
	def->magic[2] = 'A';
	def->magic[3] = 'M';
	def->major_version = 0; // Indicator to write file def later.
	def->minor_version = 0;
	memset(def->file_id, 0, 20);
	strncpy(def->file_id, filename, 20);

	fd->version = major_version * 256 + minor_version;

	/* SAM header written later along with this file_def */
    }

    cram_init_tables(fd);

    fd->prefix = strdup((cp = strrchr(filename, '/')) ? cp+1 : filename);
    if (!fd->prefix)
	goto err;
    fd->first_base = fd->last_base = -1;
    fd->record_counter = 0;

    fd->ctr = NULL;
    fd->refs  = refs_create();
    if (!fd->refs)
	goto err;
    fd->ref_id = -2;
    fd->ref = NULL;

    fd->decode_md = 0;
    fd->verbose = 0;
    fd->seqs_per_slice = SEQS_PER_SLICE;
    fd->slices_per_container = SLICE_PER_CNT;
    fd->embed_ref = 0;
    fd->no_ref = 0;
    fd->ignore_md5 = 0;
    fd->use_bz2 = 0;
    fd->use_rans = (CRAM_MAJOR_VERS(fd->version) >= 3);
    fd->use_lzma = 0;
    fd->multi_seq = -1;
    fd->unsorted   = 0;
    fd->shared_ref = 0;

    fd->index       = NULL;
    fd->own_pool    = 0;
    fd->pool        = NULL;
    fd->rqueue      = NULL;
    fd->job_pending = NULL;
    fd->ooc         = 0;
    fd->required_fields = INT_MAX;

    for (i = 0; i < DS_END; i++)
	fd->m[i] = cram_new_metrics();

    fd->range.refid = -2; // no ref.
    fd->eof = 1;          // See samtools issue #150
    fd->ref_fn = NULL;

    fd->bl = NULL;

    /* Initialise dummy refs from the @SQ headers */
    if (-1 == refs_from_header(fd->refs, fd, fd->header))
	goto err;

    return fd;

 err:
    if (fd)
	free(fd);

    return NULL;
}